

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_state_machine_cache.hpp
# Opt level: O1

string * __thiscall
duckdb::CSVStateMachineCache::GetObjectType_abi_cxx11_
          (string *__return_storage_ptr__,CSVStateMachineCache *this)

{
  char *pcVar1;
  size_type __dnew;
  size_type local_18;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_18 = 0x17;
  pcVar1 = (char *)::std::__cxx11::string::_M_create
                             ((ulong *)__return_storage_ptr__,(ulong)&local_18);
  (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = local_18;
  builtin_strncpy(pcVar1,"CSV_STATE_MACHINE_CACHE",0x17);
  __return_storage_ptr__->_M_string_length = local_18;
  (__return_storage_ptr__->_M_dataplus)._M_p[local_18] = '\0';
  return __return_storage_ptr__;
}

Assistant:

string GetObjectType() override {
		return ObjectType();
	}